

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O1

void proto2_unittest::TestDeprecatedLite::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  ulong uVar2;
  MessageLite *from_msg_00;
  _func_int **pp_Var3;
  Nonnull<const_char_*> pcVar4;
  Arena *arena;
  Arena *arena_00;
  
  arena_00 = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena_00 & 1) != 0) {
    arena_00 = *(Arena **)((ulong)arena_00 & 0xfffffffffffffffe);
  }
  if (from_msg == to_msg) {
    pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (from_msg,to_msg,"&from != _this");
  }
  else {
    pcVar4 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar4 == (Nonnull<const_char_*>)0x0) {
    uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((uVar1 & 0xf) != 0) {
      if ((uVar1 & 1) != 0) {
        uVar2 = from_msg[1]._internal_metadata_.ptr_;
        *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 1;
        arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
        if (((ulong)arena & 1) != 0) {
          arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
        }
        google::protobuf::internal::ArenaStringPtr::Set<>
                  ((ArenaStringPtr *)&to_msg[1]._internal_metadata_,
                   (string *)(uVar2 & 0xfffffffffffffffc),arena);
      }
      if ((uVar1 & 2) != 0) {
        from_msg_00 = (MessageLite *)from_msg[2]._vptr_MessageLite;
        if (from_msg_00 == (MessageLite *)0x0) {
          MergeImpl((TestDeprecatedLite *)&stack0xffffffffffffffd0);
          goto LAB_00d6f76e;
        }
        if ((MessageLite *)to_msg[2]._vptr_MessageLite == (MessageLite *)0x0) {
          pp_Var3 = (_func_int **)
                    google::protobuf::Arena::CopyConstruct<proto2_unittest::TestDeprecatedLite>
                              (arena_00,from_msg_00);
          to_msg[2]._vptr_MessageLite = pp_Var3;
        }
        else {
          MergeImpl((MessageLite *)to_msg[2]._vptr_MessageLite,from_msg_00);
        }
      }
      if ((uVar1 & 4) != 0) {
        *(int *)&to_msg[2]._internal_metadata_.ptr_ = (int)from_msg[2]._internal_metadata_.ptr_;
      }
      if ((uVar1 & 8) != 0) {
        *(undefined4 *)((long)&to_msg[2]._internal_metadata_.ptr_ + 4) =
             *(undefined4 *)((long)&from_msg[2]._internal_metadata_.ptr_ + 4);
      }
    }
    *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | uVar1;
    uVar2 = (from_msg->_internal_metadata_).ptr_;
    if ((uVar2 & 1) == 0) {
      return;
    }
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&to_msg->_internal_metadata_,(string *)((uVar2 & 0xfffffffffffffffe) + 8));
    return;
  }
LAB_00d6f76e:
  MergeImpl();
}

Assistant:

void TestDeprecatedLite::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestDeprecatedLite*>(&to_msg);
  auto& from = static_cast<const TestDeprecatedLite&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestDeprecatedLite)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_deprecated_field3(from._internal_deprecated_field3());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.deprecated_field4_ != nullptr);
      if (_this->_impl_.deprecated_field4_ == nullptr) {
        _this->_impl_.deprecated_field4_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.deprecated_field4_);
      } else {
        _this->_impl_.deprecated_field4_->MergeFrom(*from._impl_.deprecated_field4_);
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.deprecated_field_ = from._impl_.deprecated_field_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.deprecated_field2_ = from._impl_.deprecated_field2_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}